

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Future.cpp
# Opt level: O0

uint __thiscall Future<void>::Private::ThreadPool::ThreadContext::proc(ThreadContext *this)

{
  ThreadPool *pTVar1;
  bool bVar2;
  LockFreeQueue<Future<void>::Private::ThreadPool::Job> *this_00;
  FastSignal *this_01;
  Job *result;
  FastSignal *dequeuedSignal;
  FastSignal *enqueuedSignal;
  LockFreeQueue<Future<void>::Private::ThreadPool::Job> *queue;
  Job job;
  ThreadContext *this_local;
  
  this_00 = &this->_pool->_queue;
  this_01 = &this->_pool->_enqueuedSignal;
  pTVar1 = this->_pool;
  job.args = this;
LAB_0011e72f:
  do {
    bVar2 = LockFreeQueue<Future<void>::Private::ThreadPool::Job>::pop(this_00,(Job *)&queue);
    if (((bVar2 ^ 0xffU) & 1) != 0) {
      FastSignal::reset(this_01);
      result = (Job *)&queue;
      bVar2 = LockFreeQueue<Future<void>::Private::ThreadPool::Job>::pop(this_00,result);
      if (!bVar2) {
        FastSignal::wait(this_01,result);
        goto LAB_0011e72f;
      }
    }
    FastSignal::set(&pTVar1->_dequeuedSignal);
    if (queue == (LockFreeQueue<Future<void>::Private::ThreadPool::Job> *)0x0) {
      this->_terminated = true;
      return 0;
    }
    (*(code *)queue)(job.proc);
    Atomic::increment(&this->_pool->_processedJobs);
  } while( true );
}

Assistant:

uint proc()
      {
        Job job;
        LockFreeQueue<Job> &queue = _pool->_queue;
        FastSignal &enqueuedSignal = _pool->_enqueuedSignal;
        FastSignal &dequeuedSignal = _pool->_dequeuedSignal;
        for (;;)
        {
          while (!queue.pop(job))
          {
            enqueuedSignal.reset();
            if (queue.pop(job))
              break;
            enqueuedSignal.wait();
          }
          dequeuedSignal.set();
          if (job.proc)
          {
            job.proc(job.args);
            Atomic::increment(_pool->_processedJobs);
          }
          else
            break;
        }
        _terminated = true;
        return 0;
      }